

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorKeysTool_test.cpp
# Opt level: O1

void __thiscall jbcoin::tests::ValidatorKeysTool_test::run(ValidatorKeysTool_test *this)

{
  getVersionString_abi_cxx11_();
  testCreateKeyFile(this);
  testCreateToken(this);
  testCreateRevocation(this);
  testSign(this);
  testRunCommand(this);
  return;
}

Assistant:

void
    run() override
    {
        getVersionString();

        testCreateKeyFile ();
        testCreateToken ();
        testCreateRevocation ();
        testSign ();
        testRunCommand ();
    }